

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_error.cpp
# Opt level: O3

void __thiscall
duckdb::CSVError::CSVError
          (CSVError *this,string *error_message_p,CSVErrorType type_p,idx_t column_idx_p,
          string *csv_row_p,LinesPerBoundary error_info_p,idx_t row_byte_position,
          optional_idx byte_position_p,CSVReaderOptions *reader_options,string *fixes,
          string *current_path)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  undefined8 uVar4;
  ostream *poVar5;
  string local_1c8;
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  paVar1 = &(this->error_message).field_2;
  (this->error_message)._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (error_message_p->_M_dataplus)._M_p;
  paVar2 = &error_message_p->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar4 = *(undefined8 *)((long)&error_message_p->field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->error_message).field_2 + 8) = uVar4;
  }
  else {
    (this->error_message)._M_dataplus._M_p = pcVar3;
    (this->error_message).field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->error_message)._M_string_length = error_message_p->_M_string_length;
  (error_message_p->_M_dataplus)._M_p = (pointer)paVar2;
  error_message_p->_M_string_length = 0;
  (error_message_p->field_2)._M_local_buf[0] = '\0';
  (this->full_error_message)._M_dataplus._M_p = (pointer)&(this->full_error_message).field_2;
  (this->full_error_message)._M_string_length = 0;
  (this->full_error_message).field_2._M_local_buf[0] = '\0';
  this->type = type_p;
  this->column_idx = column_idx_p;
  paVar1 = &(this->csv_row).field_2;
  (this->csv_row)._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (csv_row_p->_M_dataplus)._M_p;
  paVar2 = &csv_row_p->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar4 = *(undefined8 *)((long)&csv_row_p->field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->csv_row).field_2 + 8) = uVar4;
  }
  else {
    (this->csv_row)._M_dataplus._M_p = pcVar3;
    (this->csv_row).field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->csv_row)._M_string_length = csv_row_p->_M_string_length;
  (csv_row_p->_M_dataplus)._M_p = (pointer)paVar2;
  csv_row_p->_M_string_length = 0;
  (csv_row_p->field_2)._M_local_buf[0] = '\0';
  (this->error_info).boundary_idx = error_info_p.boundary_idx;
  (this->error_info).lines_in_batch = error_info_p.lines_in_batch;
  this->row_byte_position = row_byte_position;
  (this->byte_position).index = byte_position_p.index;
  ::std::__cxx11::ostringstream::ostringstream(local_1a8);
  if ((reader_options->ignore_errors).value == true) {
    RemoveNewLine(&this->error_message);
  }
  if (10000 < (this->csv_row)._M_string_length) {
    pcVar3 = (this->csv_row)._M_dataplus._M_p;
    (this->csv_row)._M_string_length = 10000;
    pcVar3[10000] = '\0';
  }
  poVar5 = ::std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a8,(this->error_message)._M_dataplus._M_p,
                      (this->error_message)._M_string_length);
  local_1c8._M_dataplus._M_p._0_1_ = 10;
  ::std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)&local_1c8,1);
  poVar5 = ::std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a8,(fixes->_M_dataplus)._M_p,fixes->_M_string_length);
  local_1c8._M_dataplus._M_p._0_1_ = 10;
  ::std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)&local_1c8,1);
  CSVReaderOptions::ToString(&local_1c8,reader_options,current_path);
  ::std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,
             (char *)CONCAT71(local_1c8._M_dataplus._M_p._1_7_,local_1c8._M_dataplus._M_p._0_1_),
             local_1c8._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_1c8._M_dataplus._M_p._1_7_,local_1c8._M_dataplus._M_p._0_1_) !=
      &local_1c8.field_2) {
    operator_delete((undefined1 *)
                    CONCAT71(local_1c8._M_dataplus._M_p._1_7_,local_1c8._M_dataplus._M_p._0_1_));
  }
  local_1c8._M_dataplus._M_p._0_1_ = 10;
  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,(char *)&local_1c8,1);
  ::std::__cxx11::stringbuf::str();
  ::std::__cxx11::string::operator=((string *)&this->full_error_message,(string *)&local_1c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_1c8._M_dataplus._M_p._1_7_,local_1c8._M_dataplus._M_p._0_1_) !=
      &local_1c8.field_2) {
    operator_delete((undefined1 *)
                    CONCAT71(local_1c8._M_dataplus._M_p._1_7_,local_1c8._M_dataplus._M_p._0_1_));
  }
  ::std::__cxx11::ostringstream::~ostringstream(local_1a8);
  ::std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

CSVError::CSVError(string error_message_p, CSVErrorType type_p, idx_t column_idx_p, string csv_row_p,
                   LinesPerBoundary error_info_p, idx_t row_byte_position, optional_idx byte_position_p,
                   const CSVReaderOptions &reader_options, const string &fixes, const string &current_path)
    : error_message(std::move(error_message_p)), type(type_p), column_idx(column_idx_p), csv_row(std::move(csv_row_p)),
      error_info(error_info_p), row_byte_position(row_byte_position), byte_position(byte_position_p) {
	// What were the options
	std::ostringstream error;
	if (reader_options.ignore_errors.GetValue()) {
		RemoveNewLine(error_message);
	}
	// Let's cap the csv row to 10k bytes. For performance reasons.
	if (csv_row.size() > 10000) {
		csv_row.erase(csv_row.begin() + 10000, csv_row.end());
	}
	error << error_message << '\n';
	error << fixes << '\n';
	error << reader_options.ToString(current_path);
	error << '\n';
	full_error_message = error.str();
}